

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O2

void __thiscall
VgaDebugGenerator::Generate_Declaration(VgaDebugGenerator *this,Module *module,ofstream *fout)

{
  pointer pWVar1;
  ostream *poVar2;
  Wire *wire;
  pointer pWVar3;
  
  poVar2 = std::operator<<((ostream *)fout,"\n\n`define VGA_DBG_");
  poVar2 = std::operator<<(poVar2,(string *)module);
  std::operator<<(poVar2,"_Declaration");
  pWVar1 = (module->wires).super__Vector_base<Wire,_std::allocator<Wire>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pWVar3 = (module->wires).super__Vector_base<Wire,_std::allocator<Wire>_>._M_impl.
                super__Vector_impl_data._M_start; pWVar3 != pWVar1; pWVar3 = pWVar3 + 1) {
    std::operator<<((ostream *)fout," \\\n    wire ");
    if (1 < pWVar3->len_bits) {
      poVar2 = std::operator<<((ostream *)fout,"[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pWVar3->len_bits + -1);
      std::operator<<(poVar2,":0] ");
    }
    poVar2 = std::operator<<((ostream *)fout,"dbg_");
    poVar2 = std::operator<<(poVar2,(string *)&pWVar3->full_name);
    std::operator<<(poVar2,";");
  }
  return;
}

Assistant:

void VgaDebugGenerator::Generate_Declaration(const Module &module, std::ofstream &fout) {
    fout << "\n\n`define VGA_DBG_" << module.name << "_Declaration";
    for (const auto &wire : module.wires) {
        fout << " \\\n    wire ";
        if (wire.len_bits > 1) {
            fout << "[" << wire.len_bits - 1 << ":0] ";
        }
        fout << "dbg_" << wire.full_name << ";";
    }
}